

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

size_t dns_append_edns_opt(char *buf,size_t len,size_t max_len)

{
  char *pcVar1;
  ulong uVar2;
  ushort uVar3;
  
  pcVar1 = dns_get_edns_opt(buf,len);
  uVar2 = len;
  if (((0xb < len) && (pcVar1 == (char *)0x0)) && (uVar2 = len + 0xb, uVar2 <= max_len)) {
    pcVar1 = buf + len + 7;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1 = buf + len;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = ')';
    pcVar1[3] = '\x10';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    uVar3 = (*(ushort *)(buf + 10) << 8 | *(ushort *)(buf + 10) >> 8) + 1;
    *(ushort *)(buf + 10) = uVar3 * 0x100 | uVar3 >> 8;
  }
  return uVar2;
}

Assistant:

size_t dns_append_edns_opt(char * buf, size_t len, size_t max_len)
{
    struct dns_header_t * header = (struct dns_header_t *)buf;
    const char * opt = dns_get_edns_opt(buf, len);
    // ENDS OPT exists, do nothing to content
    if (opt)
        return len;
    // Too short, do nothing to content 
    if (len < sizeof(*header))
        return len;
    // Append EDNS OPT if there's enough space left
    if (max_len >= len + sizeof(edns_opt)) {
        memcpy(buf + len, edns_opt, sizeof(edns_opt));
        header->arcount = htons(ntohs(header->arcount) + 1);
    }
    // Return new size of content
    return len + sizeof(edns_opt);
}